

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O0

char * __thiscall
btBvhTriangleMeshShape::serialize
          (btBvhTriangleMeshShape *this,void *dataBuffer,btSerializer *serializer)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  char *structType_1;
  btChunk *chunk_3;
  int sz_1;
  void *chunk_2;
  char *structType;
  btChunk *chunk_1;
  int sz;
  void *chunk;
  btTriangleMeshShapeData *trimeshData;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  btCollisionShape *in_stack_ffffffffffffffc0;
  
  btCollisionShape::serialize
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (btSerializer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  (**(code **)(**(long **)(in_RDI + 0x40) + 0x70))(*(long **)(in_RDI + 0x40),in_RSI + 0x10,in_RDX);
  *(undefined4 *)(in_RSI + 0x48) = *(undefined4 *)(in_RDI + 0x1c);
  if ((*(long *)(in_RDI + 0x48) == 0) || (uVar1 = (**(code **)(*in_RDX + 0x68))(), (uVar1 & 1) != 0)
     ) {
    *(undefined8 *)(in_RSI + 0x30) = 0;
    *(undefined8 *)(in_RSI + 0x38) = 0;
  }
  else {
    lVar3 = (**(code **)(*in_RDX + 0x30))(in_RDX,*(undefined8 *)(in_RDI + 0x48));
    if (lVar3 == 0) {
      uVar4 = (**(code **)(*in_RDX + 0x38))(in_RDX,*(undefined8 *)(in_RDI + 0x48));
      *(undefined8 *)(in_RSI + 0x30) = uVar4;
      *(undefined8 *)(in_RSI + 0x38) = 0;
      iVar2 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x18))();
      lVar3 = (**(code **)(*in_RDX + 0x20))(in_RDX,(long)iVar2,1);
      uVar4 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x20))
                        (*(long **)(in_RDI + 0x48),*(undefined8 *)(lVar3 + 8),in_RDX);
      (**(code **)(*in_RDX + 0x28))(in_RDX,lVar3,uVar4,0x48564251,*(undefined8 *)(in_RDI + 0x48));
    }
    else {
      *(long *)(in_RSI + 0x30) = lVar3;
      *(undefined8 *)(in_RSI + 0x38) = 0;
    }
  }
  if ((*(long *)(in_RDI + 0x50) == 0) || (uVar1 = (**(code **)(*in_RDX + 0x68))(), (uVar1 & 2) != 0)
     ) {
    *(undefined8 *)(in_RSI + 0x40) = 0;
  }
  else {
    lVar3 = (**(code **)(*in_RDX + 0x30))(in_RDX,*(undefined8 *)(in_RDI + 0x50));
    if (lVar3 == 0) {
      uVar4 = (**(code **)(*in_RDX + 0x38))(in_RDX,*(undefined8 *)(in_RDI + 0x50));
      *(undefined8 *)(in_RSI + 0x40) = uVar4;
      iVar2 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x10))();
      lVar3 = (**(code **)(*in_RDX + 0x20))(in_RDX,(long)iVar2,1);
      uVar4 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x18))
                        (*(long **)(in_RDI + 0x50),*(undefined8 *)(lVar3 + 8),in_RDX);
      (**(code **)(*in_RDX + 0x28))(in_RDX,lVar3,uVar4,0x50414d54,*(undefined8 *)(in_RDI + 0x50));
    }
    else {
      *(long *)(in_RSI + 0x40) = lVar3;
    }
  }
  return "btTriangleMeshShapeData";
}

Assistant:

const char*	btBvhTriangleMeshShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btTriangleMeshShapeData* trimeshData = (btTriangleMeshShapeData*) dataBuffer;

	btCollisionShape::serialize(&trimeshData->m_collisionShapeData,serializer);

	m_meshInterface->serialize(&trimeshData->m_meshInterface, serializer);

	trimeshData->m_collisionMargin = float(m_collisionMargin);

	

	if (m_bvh && !(serializer->getSerializationFlags()&BT_SERIALIZE_NO_BVH))
	{
		void* chunk = serializer->findPointer(m_bvh);
		if (chunk)
		{
#ifdef BT_USE_DOUBLE_PRECISION
			trimeshData->m_quantizedDoubleBvh = (btQuantizedBvhData*)chunk;
			trimeshData->m_quantizedFloatBvh = 0;
#else
			trimeshData->m_quantizedFloatBvh  = (btQuantizedBvhData*)chunk;
			trimeshData->m_quantizedDoubleBvh= 0;
#endif //BT_USE_DOUBLE_PRECISION
		} else
		{

#ifdef BT_USE_DOUBLE_PRECISION
			trimeshData->m_quantizedDoubleBvh = (btQuantizedBvhData*)serializer->getUniquePointer(m_bvh);
			trimeshData->m_quantizedFloatBvh = 0;
#else
			trimeshData->m_quantizedFloatBvh  = (btQuantizedBvhData*)serializer->getUniquePointer(m_bvh);
			trimeshData->m_quantizedDoubleBvh= 0;
#endif //BT_USE_DOUBLE_PRECISION
	
			int sz = m_bvh->calculateSerializeBufferSizeNew();
			btChunk* chunk = serializer->allocate(sz,1);
			const char* structType = m_bvh->serialize(chunk->m_oldPtr, serializer);
			serializer->finalizeChunk(chunk,structType,BT_QUANTIZED_BVH_CODE,m_bvh);
		}
	} else
	{
		trimeshData->m_quantizedFloatBvh = 0;
		trimeshData->m_quantizedDoubleBvh = 0;
	}

	

	if (m_triangleInfoMap && !(serializer->getSerializationFlags()&BT_SERIALIZE_NO_TRIANGLEINFOMAP))
	{
		void* chunk = serializer->findPointer(m_triangleInfoMap);
		if (chunk)
		{
			trimeshData->m_triangleInfoMap = (btTriangleInfoMapData*)chunk;
		} else
		{
			trimeshData->m_triangleInfoMap = (btTriangleInfoMapData*)serializer->getUniquePointer(m_triangleInfoMap);
			int sz = m_triangleInfoMap->calculateSerializeBufferSize();
			btChunk* chunk = serializer->allocate(sz,1);
			const char* structType = m_triangleInfoMap->serialize(chunk->m_oldPtr, serializer);
			serializer->finalizeChunk(chunk,structType,BT_TRIANLGE_INFO_MAP,m_triangleInfoMap);
		}
	} else
	{
		trimeshData->m_triangleInfoMap = 0;
	}

	return "btTriangleMeshShapeData";
}